

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O2

double __thiscall libDAI::NDP::ConstructOptimalAssignments(NDP *this)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  reference pvVar3;
  ostream *poVar4;
  size_t i;
  ulong uVar5;
  ulong __n;
  ulong varOrderI;
  valConf solution;
  value_type local_40;
  
  iVar2 = (*(this->_g->super_GraphicalModel)._vptr_GraphicalModel[5])();
  __n = CONCAT44(extraout_var,iVar2) - 1;
  pvVar3 = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::at
                     (&this->_m_newFacs,__n);
  dVar1 = *(pvVar3->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Props).verbose != 0) {
    std::operator<<((ostream *)&std::cout,"NDP::ConstructOptimalAssignments() - value=");
    poVar4 = std::ostream::_M_insert<double>(dVar1);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  varOrderI = __n;
  for (uVar5 = 0; uVar5 <= __n; uVar5 = uVar5 + 1) {
    SelectStateForVar(this,varOrderI);
    varOrderI = varOrderI - 1;
  }
  local_40.first = dVar1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_40.second,&this->_m_bestConfiguration);
  std::__cxx11::
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::push_front(&this->_valConfs,&local_40);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_40.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return dVar1;
}

Assistant:

double NDP::ConstructOptimalAssignments()
    {

        size_t lastVarI =  _g->nrVars()-1;

        //the optimal value is directly given by the factor introduced for
        //the very last variable! - which has 1 local state (the empty one)
        double value = _m_newFacs.at(lastVarI)[0];
        
        if(Props.verbose >= 1)
            cout << "NDP::ConstructOptimalAssignments() - value="<<value<<endl;

        //traverse the variables in reverse order:
        for(size_t i=0; i <= lastVarI; i++)
        {
            //reverse order index:
            size_t rI = lastVarI - i;
            SelectStateForVar(rI);
        }

        valConf solution = make_pair(value, _m_bestConfiguration );
        _valConfs.push_front(solution);

        return(value);
    }